

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O1

mat4 * mat4_translation(mat4 *__return_storage_ptr__,vec3 v)

{
  __return_storage_ptr__->m[0] = 1.0;
  __return_storage_ptr__->m[1] = 0.0;
  __return_storage_ptr__->m[2] = 0.0;
  __return_storage_ptr__->m[3] = v.x;
  __return_storage_ptr__->m[4] = 0.0;
  __return_storage_ptr__->m[5] = 1.0;
  __return_storage_ptr__->m[6] = 0.0;
  __return_storage_ptr__->m[7] = v.y;
  __return_storage_ptr__->m[8] = 0.0;
  __return_storage_ptr__->m[9] = 0.0;
  __return_storage_ptr__->m[10] = 1.0;
  __return_storage_ptr__->m[0xb] = v.z;
  __return_storage_ptr__->m[0xc] = 0.0;
  __return_storage_ptr__->m[0xd] = 0.0;
  __return_storage_ptr__->m[0xe] = 0.0;
  __return_storage_ptr__->m[0xf] = 1.0;
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4_translation(vec3 v) {
    return mat4_create(
            1.0, 0.0, 0.0, v.x,
            0.0, 1.0, 0.0, v.y,
            0.0, 0.0, 1.0, v.z,
            0.0, 0.0, 0.0, 1.0);
}